

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O0

bool ImNodes::BeginNode(void *node_id,ImVec2 *pos,bool *selected)

{
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  long local_40;
  _CanvasStateImpl *impl;
  CanvasState *canvas;
  ImDrawList *draw_list;
  ImGuiStyle *style;
  bool *selected_local;
  ImVec2 *pos_local;
  void *node_id_local;
  
  style = (ImGuiStyle *)selected;
  selected_local = (bool *)pos;
  pos_local = (ImVec2 *)node_id;
  if (gCanvas == (_CanvasStateImpl *)0x0) {
    __assert_fail("gCanvas != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x179,"bool ImNodes::BeginNode(void *, ImVec2 *, bool *)");
  }
  if (node_id == (void *)0x0) {
    __assert_fail("node_id != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x17a,"bool ImNodes::BeginNode(void *, ImVec2 *, bool *)");
  }
  if (pos == (ImVec2 *)0x0) {
    __assert_fail("pos != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x17b,"bool ImNodes::BeginNode(void *, ImVec2 *, bool *)");
  }
  if (selected != (bool *)0x0) {
    draw_list = (ImDrawList *)ImGui::GetStyle();
    canvas = (CanvasState *)ImGui::GetWindowDrawList();
    impl = gCanvas;
    local_40 = *(long *)&gCanvas->ignore_connections;
    *(ImVec2 **)(local_40 + 0x10) = pos_local;
    *(bool **)(local_40 + 0x18) = selected_local;
    *(ImGuiStyle **)(local_40 + 0x20) = style;
    ImDrawList::ChannelsSplit((ImDrawList *)canvas,2);
    if (pos_local == *(ImVec2 **)(local_40 + 0x38)) {
      local_58 = ImGui::GetWindowPos();
      local_60 = ImGui::GetWindowSize();
      local_50 = operator+(&local_58,&local_60);
      local_48 = operator+(&local_50,(ImVec2 *)&(draw_list->CmdBuffer).Capacity);
      ImGui::SetCursorScreenPos(&local_48);
    }
    else {
      local_78 = ImGui::GetWindowPos();
      local_80 = ::operator*((ImVec2 *)selected_local,(float)(impl->cached_data).Data.Size);
      local_70 = operator+(&local_78,&local_80);
      local_68 = operator+(&local_70,(ImVec2 *)&(impl->cached_data).Data.Capacity);
      ImGui::SetCursorScreenPos(&local_68);
    }
    ImGui::PushID(pos_local);
    ImGui::BeginGroup();
    ImDrawList::ChannelsSetCurrent((ImDrawList *)canvas,1);
    return true;
  }
  __assert_fail("selected != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                ,0x17c,"bool ImNodes::BeginNode(void *, ImVec2 *, bool *)");
}

Assistant:

bool BeginNode(void* node_id, ImVec2* pos, bool* selected)
{
    assert(gCanvas != nullptr);
    assert(node_id != nullptr);
    assert(pos != nullptr);
    assert(selected != nullptr);
    const ImGuiStyle& style = ImGui::GetStyle();
    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;

    impl->node.id = node_id;
    impl->node.pos = pos;
    impl->node.selected = selected;

    // 0 - node rect, curves
    // 1 - node content
    draw_list->ChannelsSplit(2);

    if (node_id == impl->auto_position_node_id)
    {
        // Somewhere out of view so that we dont see node flicker when it will be repositioned
        ImGui::SetCursorScreenPos(ImGui::GetWindowPos() + ImGui::GetWindowSize() + style.WindowPadding);
    }
    else
    {
        // Top-let corner of the node
        ImGui::SetCursorScreenPos(ImGui::GetWindowPos() + (*pos) * canvas->zoom + canvas->offset);
    }

    ImGui::PushID(node_id);

    ImGui::BeginGroup();    // Slots and content group
    draw_list->ChannelsSetCurrent(1);

    return true;
}